

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::builtins::AssertControlTask::bindArgument
          (AssertControlTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  bool bVar1;
  Expression *pEVar2;
  
  bVar1 = argIndex != 0;
  if (this->isFullMethod != false) {
    bVar1 = 3 < argIndex;
  }
  if (bVar1) {
    bVar1 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
    if (bVar1) {
      pEVar2 = ArbitrarySymbolExpression::fromSyntax
                         (((context->scope).ptr)->compilation,(NameSyntax *)syntax,context,
                          (bitmask<slang::ast::LookupFlags>)0x2000);
      return pEVar2;
    }
  }
  pEVar2 = SystemSubroutine::bindArgument((SystemSubroutine *)this,argIndex,context,syntax,args);
  return pEVar2;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if ((isFullMethod && argIndex < 4) || (!isFullMethod && argIndex == 0) ||
            !NameSyntax::isKind(syntax.kind)) {
            return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
        }

        return ArbitrarySymbolExpression::fromSyntax(context.getCompilation(),
                                                     syntax.as<NameSyntax>(), context,
                                                     LookupFlags::AlwaysAllowUpward);
    }